

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O2

mpt_named_traits * mpt_named_traits(char *name,int len)

{
  byte bVar1;
  mpt_named_traits *pmVar2;
  char *__s2;
  mpt_named_traits **ppmVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  named_traits_chunk *pnVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  
  if ((len != 0 && name != (char *)0x0) && (*name != '\0')) {
    if (len < 0) {
      sVar5 = strlen(name);
      if ((int)sVar5 != 0) {
        iVar4 = strcmp(name,"log");
        if (iVar4 == 0) {
          pcVar10 = "logger";
        }
        else {
          iVar4 = strcmp(name,"iter");
          if (iVar4 == 0) {
            pcVar10 = "iterator";
          }
          else {
            iVar4 = strcmp(name,"out");
            if (iVar4 == 0) {
              pcVar10 = "output";
            }
            else {
              iVar4 = strcmp(name,"meta");
              pcVar10 = "metatype";
              if (iVar4 != 0) {
                pcVar10 = name;
              }
            }
          }
        }
        pnVar7 = meta_types;
        if (meta_types == (named_traits_chunk *)0x0) {
          _meta_init();
          pnVar7 = meta_types;
        }
        for (; pnVar7 != (named_traits_chunk *)0x0; pnVar7 = pnVar7->next) {
          bVar1 = pnVar7->used;
          for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
            pmVar2 = pnVar7->traits[uVar9];
            __s2 = pmVar2->name;
            if ((__s2 != (char *)0x0) && (iVar4 = strcmp(pcVar10,__s2), iVar4 == 0)) {
              return pmVar2;
            }
          }
        }
        if (interface_types == (mpt_named_traits **)0x0) {
          _interfaces_init();
        }
        ppmVar3 = interface_types;
        uVar8 = 0;
        uVar9 = (ulong)(uint)interface_pos;
        if (interface_pos < 1) {
          uVar9 = uVar8;
        }
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          pmVar2 = ppmVar3[uVar8];
          if (((pmVar2 != (mpt_named_traits *)0x0) && (pmVar2->name != (char *)0x0)) &&
             (iVar4 = strcmp(pcVar10,pmVar2->name), iVar4 == 0)) {
            return pmVar2;
          }
        }
      }
    }
    else {
      pnVar7 = meta_types;
      if (meta_types == (named_traits_chunk *)0x0) {
        _meta_init();
        pnVar7 = meta_types;
      }
      for (; pnVar7 != (named_traits_chunk *)0x0; pnVar7 = pnVar7->next) {
        bVar1 = pnVar7->used;
        for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
          pmVar2 = pnVar7->traits[uVar9];
          pcVar10 = pmVar2->name;
          if (((pcVar10 != (char *)0x0) && (sVar5 = strlen(pcVar10), (int)sVar5 == len)) &&
             (iVar4 = strncmp(name,pcVar10,(ulong)(uint)len), iVar4 == 0)) {
            return pmVar2;
          }
        }
      }
      if (interface_types == (mpt_named_traits **)0x0) {
        _interfaces_init();
      }
      ppmVar3 = interface_types;
      uVar8 = 0;
      uVar9 = (ulong)(uint)interface_pos;
      if (interface_pos < 1) {
        uVar9 = uVar8;
      }
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        pmVar2 = ppmVar3[uVar8];
        if (((pmVar2 != (mpt_named_traits *)0x0) && (pcVar10 = pmVar2->name, pcVar10 != (char *)0x0)
            ) && ((sVar5 = strlen(pcVar10), (int)sVar5 == len &&
                  (iVar4 = strncmp(name,pcVar10,(ulong)(uint)len), iVar4 == 0)))) {
          return pmVar2;
        }
      }
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  return (mpt_named_traits *)0x0;
}

Assistant:

extern const MPT_STRUCT(named_traits) *mpt_named_traits(const char *name, int len)
{
	const struct named_traits_chunk *ext;
	
	int i;
	
	if (!name || !len || !*name) {
		errno = EINVAL;
		return 0;
	}
	/* exact length match for names */
	if (len >= 0) {
		if (!(ext = meta_types)) {
			_meta_init();
			ext = meta_types;
		}
		while (ext) {
			for (i = 0; i < ext->used; i++) {
				const MPT_STRUCT(named_traits) *elem = ext->traits[i];
				if (elem->name
				 && (len == (int) strlen(elem->name))
				 && !strncmp(name, elem->name, len)) {
					return elem;
				}
			}
			ext = ext->next;
		}
		if (!interface_types) {
			_interfaces_init();
		}
		for (i = 0; i < interface_pos; i++) {
			const MPT_STRUCT(named_traits) *elem;
			if ((elem = interface_types[i])
			 && elem->name
			 && (len == (int) strlen(elem->name))
			 && !strncmp(name, elem->name, len)) {
				return elem;
			}
		}
		errno = EINVAL;
		return 0;
	}
	/* full names without length limit */
	if (!(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	/* resolve shortnames */
	if (!strcmp(name, "log")) {
		name = "logger";
	}
	else if (!strcmp(name, "iter")) {
		name = "iterator";
	}
	else if (!strcmp(name, "out")) {
		name = "output";
	}
	else if (!strcmp(name, "meta")) {
		name = "metatype";
	}
	if (!(ext = meta_types)) {
		_meta_init();
		ext = meta_types;
	}
	while (ext) {
		for (i = 0; i < ext->used; i++) {
			const MPT_STRUCT(named_traits) *elem = ext->traits[i];
			if (elem->name && !strcmp(name, elem->name)) {
				return elem;
			}
		}
		ext = ext->next;
	}
	if (!interface_types) {
		_interfaces_init();
	}
	for (i = 0; i < interface_pos; i++) {
		const MPT_STRUCT(named_traits) *elem = interface_types[i];
		if (elem && elem->name && !strcmp(name, elem->name)) {
			return elem;
		}
	}
	errno = EINVAL;
	return 0;
}